

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

void __thiscall calculator::Function::~Function(Function *this)

{
  Function *this_local;
  
  Word::~Word(&this->super_Word);
  return;
}

Assistant:

Function(const std::string& name, bool minus = false)
        : Word(name, minus, Tag::Function) {}